

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O1

int randomx::scheduleUop<true>(type uop,type (*portBusy) [174] [3],int cycle)

{
  type *ptVar1;
  long lVar2;
  
  if (cycle < 0xae) {
    lVar2 = (long)cycle;
    ptVar1 = (*portBusy)[lVar2] + 1;
    do {
      lVar2 = lVar2 + 1;
      if (((uop & 4U) != 0) && (ptVar1[1] == 0)) {
        ptVar1 = ptVar1 + 1;
LAB_00122671:
        *ptVar1 = uop;
        return cycle;
      }
      if (((uop & 1U) != 0) && ((*(type (*) [3])(ptVar1 + -1))[0] == 0)) {
        ptVar1 = ptVar1 + -1;
        goto LAB_00122671;
      }
      if (((uop & 2U) != 0) && (*ptVar1 == 0)) goto LAB_00122671;
      cycle = cycle + 1;
      ptVar1 = ptVar1 + 3;
    } while ((int)lVar2 != 0xae);
  }
  return -1;
}

Assistant:

static int scheduleUop(ExecutionPort::type uop, ExecutionPort::type(&portBusy)[CYCLE_MAP_SIZE][3], int cycle) {
		//The scheduling here is done optimistically by checking port availability in order P5 -> P0 -> P1 to not overload
		//port P1 (multiplication) by instructions that can go to any port.
		for (; cycle < CYCLE_MAP_SIZE; ++cycle) {
			if ((uop & ExecutionPort::P5) != 0 && !portBusy[cycle][2]) {
				if (commit) {
					if (trace) std::cout << "; P5 at cycle " << cycle << std::endl;
					portBusy[cycle][2] = uop;
				}
				return cycle;
			}
			if ((uop & ExecutionPort::P0) != 0 && !portBusy[cycle][0]) {
				if (commit) {
					if (trace) std::cout << "; P0 at cycle " << cycle << std::endl;
					portBusy[cycle][0] = uop;
				}
				return cycle;
			}
			if ((uop & ExecutionPort::P1) != 0 && !portBusy[cycle][1]) {
				if (commit) {
					if (trace) std::cout << "; P1 at cycle " << cycle << std::endl;
					portBusy[cycle][1] = uop;
				}
				return cycle;
			}
		}
		return -1;
	}